

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_horizontal_4_sse2
               (uint16_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  uint8_t *in_R8;
  uint in_R9D;
  ushort uVar11;
  ushort uVar18;
  ulong uVar12;
  ushort uVar16;
  ushort uVar17;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar22;
  undefined1 auVar23 [16];
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i q1q0;
  __m128i p1p0;
  __m128i t80;
  __m128i abs_p1p0;
  __m128i pq [2];
  __m128i q1q0_1;
  __m128i p1p0_1;
  __m128i hev;
  __m128i mask;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i filter1filt;
  __m128i filter2filt;
  __m128i filter2filter1;
  __m128i filt;
  __m128i work;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i t3t4;
  __m128i pmin;
  __m128i pmax;
  __m128i one;
  __m128i zero;
  __m128i *blt;
  __m128i *lt;
  __m128i *q1q0_00;
  __m128i *p1p0_00;
  ulong *puVar24;
  __m128i *pq_00;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [52];
  int local_8b4;
  undefined8 *local_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 *local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 *local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 *local_830;
  longlong local_7a8;
  longlong lStack_7a0;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  longlong local_768 [2];
  longlong local_758 [2];
  ulong local_748 [2];
  longlong local_738 [2];
  longlong local_728 [2];
  longlong local_718 [2];
  longlong local_708 [2];
  uint local_6f4;
  undefined1 (*local_6d8) [16];
  undefined1 (*local_6d0) [16];
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_658;
  undefined1 local_648 [16];
  undefined8 local_638;
  uint uStack_62c;
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  __m128i *local_5a0;
  undefined1 (*local_598) [16];
  __m128i *in_stack_fffffffffffffb40;
  __m128i *in_stack_fffffffffffffb48;
  undefined6 in_stack_fffffffffffffb50;
  undefined2 in_stack_fffffffffffffb56;
  __m128i *in_stack_fffffffffffffb58;
  undefined4 uStack_4a0;
  undefined4 uStack_490;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  local_830 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * -2);
  local_908 = *local_830;
  uStack_840 = 0;
  uStack_900 = 0;
  local_850 = (undefined8 *)((long)in_RDI + (long)in_ESI * -2);
  local_918 = *local_850;
  uStack_860 = 0;
  uStack_910 = 0;
  local_928 = *in_RDI;
  uStack_880 = 0;
  uStack_920 = 0;
  local_890 = (undefined8 *)((long)in_RDI + (long)in_ESI * 2);
  local_938 = *local_890;
  uStack_8a0 = 0;
  uStack_930 = 0;
  local_6b0 = &local_908;
  local_6b8 = &local_918;
  local_6c0 = &local_928;
  local_6c8 = &local_938;
  local_6d0 = &local_8f8;
  local_6d8 = (undefined1 (*) [16])local_8e8;
  blt = &local_708;
  lt = &local_718;
  local_8b4 = in_ESI;
  local_8b0 = in_RDI;
  local_8a8 = local_938;
  local_888 = local_928;
  local_868 = local_918;
  local_848 = local_908;
  local_6f4 = in_R9D;
  get_limit(in_RDX,in_RCX,in_R8,in_R9D,blt,lt,&local_728,(__m128i *)&local_7a8);
  local_788 = *local_6b8;
  uStack_670 = local_6b8[1];
  uStack_780 = *local_6c0;
  uStack_680 = local_6c0[1];
  local_778 = *local_6b0;
  uStack_690 = local_6b0[1];
  uStack_770 = *local_6c8;
  uStack_6a0 = local_6c8[1];
  pq_00 = &local_738;
  puVar24 = local_748;
  q1q0_00 = &local_758;
  p1p0_00 = &local_768;
  local_6a8 = uStack_770;
  local_698 = local_778;
  local_688 = uStack_780;
  local_678 = local_788;
  highbd_hev_filter_mask_x_sse2
            (pq_00,(int)((ulong)puVar24 >> 0x20),p1p0_00,q1q0_00,lt,blt,in_stack_fffffffffffffb40,
             in_stack_fffffffffffffb48,
             (__m128i *)CONCAT26(in_stack_fffffffffffffb56,in_stack_fffffffffffffb50),
             in_stack_fffffffffffffb58);
  local_598 = local_6d8;
  auVar23._8_8_ = 0x1000100010001;
  auVar23._0_8_ = 0x1000100010001;
  auVar23 = psllw(auVar23,ZEXT416(local_6f4));
  auVar14._8_8_ = 0x1000100010001;
  auVar14._0_8_ = 0x1000100010001;
  auVar23 = psubsw(auVar23,auVar14);
  auVar6._8_8_ = lStack_7a0;
  auVar6._0_8_ = local_7a8;
  auVar23 = psubsw(auVar23,auVar6);
  auVar7._8_8_ = lStack_7a0;
  auVar7._0_8_ = local_7a8;
  auVar13 = psubsw(ZEXT816(0),auVar7);
  auVar8._8_8_ = lStack_7a0;
  auVar8._0_8_ = local_7a8;
  auVar14 = psubsw((undefined1  [16])*q1q0_00,auVar8);
  auVar9._8_8_ = lStack_7a0;
  auVar9._0_8_ = local_7a8;
  auVar15 = psubsw((undefined1  [16])*p1p0_00,auVar9);
  local_628 = psubsw(auVar14,auVar15);
  local_98 = local_628._0_2_;
  sStack_96 = local_628._2_2_;
  sStack_94 = local_628._4_2_;
  sStack_92 = local_628._6_2_;
  sStack_90 = local_628._8_2_;
  sStack_8e = local_628._10_2_;
  sStack_8c = local_628._12_2_;
  sStack_8a = local_628._14_2_;
  local_a8 = auVar23._0_2_;
  sStack_a6 = auVar23._2_2_;
  sStack_a4 = auVar23._4_2_;
  sStack_a2 = auVar23._6_2_;
  sStack_a0 = auVar23._8_2_;
  sStack_9e = auVar23._10_2_;
  sStack_9c = auVar23._12_2_;
  sStack_9a = auVar23._14_2_;
  uVar11 = (ushort)(local_a8 < local_98) * local_a8 | (ushort)(local_a8 >= local_98) * local_98;
  uVar16 = (ushort)(sStack_a6 < sStack_96) * sStack_a6 |
           (ushort)(sStack_a6 >= sStack_96) * sStack_96;
  uVar17 = (ushort)(sStack_a4 < sStack_94) * sStack_a4 |
           (ushort)(sStack_a4 >= sStack_94) * sStack_94;
  uVar18 = (ushort)(sStack_a2 < sStack_92) * sStack_a2 |
           (ushort)(sStack_a2 >= sStack_92) * sStack_92;
  uVar19 = (ushort)(sStack_a0 < sStack_90) * sStack_a0 |
           (ushort)(sStack_a0 >= sStack_90) * sStack_90;
  uVar20 = (ushort)(sStack_9e < sStack_8e) * sStack_9e |
           (ushort)(sStack_9e >= sStack_8e) * sStack_8e;
  uVar21 = (ushort)(sStack_9c < sStack_8c) * sStack_9c |
           (ushort)(sStack_9c >= sStack_8c) * sStack_8c;
  uVar22 = (ushort)(sStack_9a < sStack_8a) * sStack_9a |
           (ushort)(sStack_9a >= sStack_8a) * sStack_8a;
  local_628._0_2_ = uVar11;
  local_628._2_2_ = uVar16;
  local_628._4_2_ = uVar17;
  local_628._6_2_ = uVar18;
  local_628._8_2_ = uVar19;
  local_628._10_2_ = uVar20;
  local_628._12_2_ = uVar21;
  local_628._14_2_ = uVar22;
  local_1a8 = auVar13._0_2_;
  sStack_1a6 = auVar13._2_2_;
  sStack_1a4 = auVar13._4_2_;
  sStack_1a2 = auVar13._6_2_;
  sStack_1a0 = auVar13._8_2_;
  sStack_19e = auVar13._10_2_;
  sStack_19c = auVar13._12_2_;
  sStack_19a = auVar13._14_2_;
  local_628._0_2_ =
       (ushort)((short)uVar11 < local_1a8) * local_1a8 | ((short)uVar11 >= local_1a8) * uVar11;
  local_628._2_2_ =
       (ushort)((short)uVar16 < sStack_1a6) * sStack_1a6 | ((short)uVar16 >= sStack_1a6) * uVar16;
  local_628._4_2_ =
       (ushort)((short)uVar17 < sStack_1a4) * sStack_1a4 | ((short)uVar17 >= sStack_1a4) * uVar17;
  local_628._6_2_ =
       (ushort)((short)uVar18 < sStack_1a2) * sStack_1a2 | ((short)uVar18 >= sStack_1a2) * uVar18;
  local_628._8_2_ =
       (ushort)((short)uVar19 < sStack_1a0) * sStack_1a0 | ((short)uVar19 >= sStack_1a0) * uVar19;
  local_628._10_2_ =
       (ushort)((short)uVar20 < sStack_19e) * sStack_19e | ((short)uVar20 >= sStack_19e) * uVar20;
  local_628._12_2_ =
       (ushort)((short)uVar21 < sStack_19c) * sStack_19c | ((short)uVar21 >= sStack_19c) * uVar21;
  local_628._14_2_ =
       (ushort)((short)uVar22 < sStack_19a) * sStack_19a | ((short)uVar22 >= sStack_19a) * uVar22;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_628._8_8_ & *puVar24;
  auVar23 = psubsw(auVar1,local_628);
  auVar23 = psubsw(auVar23,local_628);
  auVar23 = psubsw(auVar23,local_628);
  local_638 = auVar23._0_8_;
  local_78 = auVar23._0_2_;
  sStack_76 = auVar23._2_2_;
  sStack_74 = auVar23._4_2_;
  sStack_72 = auVar23._6_2_;
  uVar11 = (ushort)(local_a8 < local_78) * local_a8 | (ushort)(local_a8 >= local_78) * local_78;
  uVar16 = (ushort)(sStack_a6 < sStack_76) * sStack_a6 |
           (ushort)(sStack_a6 >= sStack_76) * sStack_76;
  uVar17 = (ushort)(sStack_a4 < sStack_74) * sStack_a4 |
           (ushort)(sStack_a4 >= sStack_74) * sStack_74;
  uVar18 = (ushort)(sStack_a2 < sStack_72) * sStack_a2 |
           (ushort)(sStack_a2 >= sStack_72) * sStack_72;
  local_638._0_2_ = uVar11;
  local_638._2_2_ = uVar16;
  local_638._4_2_ = uVar17;
  local_638._6_2_ = uVar18;
  local_638._0_2_ =
       (ushort)((short)uVar11 < local_1a8) * local_1a8 | ((short)uVar11 >= local_1a8) * uVar11;
  local_638._2_2_ =
       (ushort)((short)uVar16 < sStack_1a6) * sStack_1a6 | ((short)uVar16 >= sStack_1a6) * uVar16;
  local_638._4_2_ =
       (ushort)((short)uVar17 < sStack_1a4) * sStack_1a4 | ((short)uVar17 >= sStack_1a4) * uVar17;
  local_638._6_2_ =
       (ushort)((short)uVar18 < sStack_1a2) * sStack_1a2 | ((short)uVar18 >= sStack_1a2) * uVar18;
  uVar12 = local_638 & (*pq_00)[0];
  auVar5._8_8_ = uVar12;
  auVar5._0_8_ = uVar12;
  auVar4._8_8_ = 0x3000300030003;
  auVar4._0_8_ = 0x4000400040004;
  local_648 = paddsw(auVar5,auVar4);
  local_58 = local_648._0_2_;
  sStack_56 = local_648._2_2_;
  sStack_54 = local_648._4_2_;
  sStack_52 = local_648._6_2_;
  sStack_50 = local_648._8_2_;
  sStack_4e = local_648._10_2_;
  sStack_4c = local_648._12_2_;
  sStack_4a = local_648._14_2_;
  uVar11 = (ushort)(local_a8 < local_58) * local_a8 | (ushort)(local_a8 >= local_58) * local_58;
  uVar16 = (ushort)(sStack_a6 < sStack_56) * sStack_a6 |
           (ushort)(sStack_a6 >= sStack_56) * sStack_56;
  uVar17 = (ushort)(sStack_a4 < sStack_54) * sStack_a4 |
           (ushort)(sStack_a4 >= sStack_54) * sStack_54;
  uVar18 = (ushort)(sStack_a2 < sStack_52) * sStack_a2 |
           (ushort)(sStack_a2 >= sStack_52) * sStack_52;
  uVar19 = (ushort)(sStack_a0 < sStack_50) * sStack_a0 |
           (ushort)(sStack_a0 >= sStack_50) * sStack_50;
  uVar20 = (ushort)(sStack_9e < sStack_4e) * sStack_9e |
           (ushort)(sStack_9e >= sStack_4e) * sStack_4e;
  uVar21 = (ushort)(sStack_9c < sStack_4c) * sStack_9c |
           (ushort)(sStack_9c >= sStack_4c) * sStack_4c;
  uVar22 = (ushort)(sStack_9a < sStack_4a) * sStack_9a |
           (ushort)(sStack_9a >= sStack_4a) * sStack_4a;
  local_648._0_2_ = uVar11;
  local_648._2_2_ = uVar16;
  local_648._4_2_ = uVar17;
  local_648._6_2_ = uVar18;
  local_648._8_2_ = uVar19;
  local_648._10_2_ = uVar20;
  local_648._12_2_ = uVar21;
  local_648._14_2_ = uVar22;
  local_648._0_2_ =
       (ushort)((short)uVar11 < local_1a8) * local_1a8 | ((short)uVar11 >= local_1a8) * uVar11;
  local_648._2_2_ =
       (ushort)((short)uVar16 < sStack_1a6) * sStack_1a6 | ((short)uVar16 >= sStack_1a6) * uVar16;
  local_648._4_2_ =
       (ushort)((short)uVar17 < sStack_1a4) * sStack_1a4 | ((short)uVar17 >= sStack_1a4) * uVar17;
  local_648._6_2_ =
       (ushort)((short)uVar18 < sStack_1a2) * sStack_1a2 | ((short)uVar18 >= sStack_1a2) * uVar18;
  local_648._8_2_ =
       (ushort)((short)uVar19 < sStack_1a0) * sStack_1a0 | ((short)uVar19 >= sStack_1a0) * uVar19;
  local_648._10_2_ =
       (ushort)((short)uVar20 < sStack_19e) * sStack_19e | ((short)uVar20 >= sStack_19e) * uVar20;
  local_648._12_2_ =
       (ushort)((short)uVar21 < sStack_19c) * sStack_19c | ((short)uVar21 >= sStack_19c) * uVar21;
  local_648._14_2_ =
       (ushort)((short)uVar22 < sStack_19a) * sStack_19a | ((short)uVar22 >= sStack_19a) * uVar22;
  auVar23 = psraw(local_648,ZEXT416(3));
  local_648._0_8_ = auVar23._0_8_;
  auVar3._8_8_ = local_648._0_8_;
  auVar3._0_8_ = local_648._0_8_;
  auVar2._8_8_ = 0x1000100010001;
  auVar2._0_8_ = 0x1000100010001;
  auVar13 = paddsw(auVar3,auVar2);
  auVar13 = psraw(auVar13,ZEXT416(1));
  local_638 = auVar13._0_8_;
  uStack_62c = ~(uint)(puVar24[1] >> 0x20) & auVar13._12_4_;
  local_648._12_4_ = auVar23._12_4_;
  local_648._4_4_ = uStack_62c;
  local_648._0_4_ = uStack_4a0;
  auVar13._8_8_ = ~*puVar24 & local_638;
  auVar13._0_8_ = local_648._0_8_;
  local_618 = psubsw(auVar15,auVar13);
  auVar15._12_4_ = local_648._12_4_;
  auVar15._8_4_ = uStack_490;
  auVar15._0_8_ = local_658;
  local_608 = paddsw(auVar14,auVar15);
  local_38 = local_618._0_2_;
  sStack_36 = local_618._2_2_;
  sStack_34 = local_618._4_2_;
  sStack_32 = local_618._6_2_;
  sStack_30 = local_618._8_2_;
  sStack_2e = local_618._10_2_;
  sStack_2c = local_618._12_2_;
  sStack_2a = local_618._14_2_;
  uVar11 = (ushort)(local_a8 < local_38) * local_a8 | (ushort)(local_a8 >= local_38) * local_38;
  uVar16 = (ushort)(sStack_a6 < sStack_36) * sStack_a6 |
           (ushort)(sStack_a6 >= sStack_36) * sStack_36;
  uVar17 = (ushort)(sStack_a4 < sStack_34) * sStack_a4 |
           (ushort)(sStack_a4 >= sStack_34) * sStack_34;
  uVar18 = (ushort)(sStack_a2 < sStack_32) * sStack_a2 |
           (ushort)(sStack_a2 >= sStack_32) * sStack_32;
  uVar19 = (ushort)(sStack_a0 < sStack_30) * sStack_a0 |
           (ushort)(sStack_a0 >= sStack_30) * sStack_30;
  uVar20 = (ushort)(sStack_9e < sStack_2e) * sStack_9e |
           (ushort)(sStack_9e >= sStack_2e) * sStack_2e;
  uVar21 = (ushort)(sStack_9c < sStack_2c) * sStack_9c |
           (ushort)(sStack_9c >= sStack_2c) * sStack_2c;
  uVar22 = (ushort)(sStack_9a < sStack_2a) * sStack_9a |
           (ushort)(sStack_9a >= sStack_2a) * sStack_2a;
  local_618._0_2_ = uVar11;
  local_618._2_2_ = uVar16;
  local_618._4_2_ = uVar17;
  local_618._6_2_ = uVar18;
  local_618._8_2_ = uVar19;
  local_618._10_2_ = uVar20;
  local_618._12_2_ = uVar21;
  local_618._14_2_ = uVar22;
  local_618._0_2_ =
       (ushort)((short)uVar11 < local_1a8) * local_1a8 | ((short)uVar11 >= local_1a8) * uVar11;
  local_618._2_2_ =
       (ushort)((short)uVar16 < sStack_1a6) * sStack_1a6 | ((short)uVar16 >= sStack_1a6) * uVar16;
  local_618._4_2_ =
       (ushort)((short)uVar17 < sStack_1a4) * sStack_1a4 | ((short)uVar17 >= sStack_1a4) * uVar17;
  local_618._6_2_ =
       (ushort)((short)uVar18 < sStack_1a2) * sStack_1a2 | ((short)uVar18 >= sStack_1a2) * uVar18;
  local_618._8_2_ =
       (ushort)((short)uVar19 < sStack_1a0) * sStack_1a0 | ((short)uVar19 >= sStack_1a0) * uVar19;
  local_618._10_2_ =
       (ushort)((short)uVar20 < sStack_19e) * sStack_19e | ((short)uVar20 >= sStack_19e) * uVar20;
  local_618._12_2_ =
       (ushort)((short)uVar21 < sStack_19c) * sStack_19c | ((short)uVar21 >= sStack_19c) * uVar21;
  local_618._14_2_ =
       (ushort)((short)uVar22 < sStack_19a) * sStack_19a | ((short)uVar22 >= sStack_19a) * uVar22;
  local_18 = local_608._0_2_;
  sStack_16 = local_608._2_2_;
  sStack_14 = local_608._4_2_;
  sStack_12 = local_608._6_2_;
  sStack_10 = local_608._8_2_;
  sStack_e = local_608._10_2_;
  sStack_c = local_608._12_2_;
  sStack_a = local_608._14_2_;
  uVar11 = (ushort)(local_a8 < local_18) * local_a8 | (ushort)(local_a8 >= local_18) * local_18;
  uVar16 = (ushort)(sStack_a6 < sStack_16) * sStack_a6 |
           (ushort)(sStack_a6 >= sStack_16) * sStack_16;
  uVar17 = (ushort)(sStack_a4 < sStack_14) * sStack_a4 |
           (ushort)(sStack_a4 >= sStack_14) * sStack_14;
  uVar18 = (ushort)(sStack_a2 < sStack_12) * sStack_a2 |
           (ushort)(sStack_a2 >= sStack_12) * sStack_12;
  uVar19 = (ushort)(sStack_a0 < sStack_10) * sStack_a0 |
           (ushort)(sStack_a0 >= sStack_10) * sStack_10;
  uVar20 = (ushort)(sStack_9e < sStack_e) * sStack_9e | (ushort)(sStack_9e >= sStack_e) * sStack_e;
  uVar21 = (ushort)(sStack_9c < sStack_c) * sStack_9c | (ushort)(sStack_9c >= sStack_c) * sStack_c;
  uVar22 = (ushort)(sStack_9a < sStack_a) * sStack_9a | (ushort)(sStack_9a >= sStack_a) * sStack_a;
  local_608._0_2_ = uVar11;
  local_608._2_2_ = uVar16;
  local_608._4_2_ = uVar17;
  local_608._6_2_ = uVar18;
  local_608._8_2_ = uVar19;
  local_608._10_2_ = uVar20;
  local_608._12_2_ = uVar21;
  local_608._14_2_ = uVar22;
  local_608._0_2_ =
       (ushort)((short)uVar11 < local_1a8) * local_1a8 | ((short)uVar11 >= local_1a8) * uVar11;
  local_608._2_2_ =
       (ushort)((short)uVar16 < sStack_1a6) * sStack_1a6 | ((short)uVar16 >= sStack_1a6) * uVar16;
  local_608._4_2_ =
       (ushort)((short)uVar17 < sStack_1a4) * sStack_1a4 | ((short)uVar17 >= sStack_1a4) * uVar17;
  local_608._6_2_ =
       (ushort)((short)uVar18 < sStack_1a2) * sStack_1a2 | ((short)uVar18 >= sStack_1a2) * uVar18;
  local_608._8_2_ =
       (ushort)((short)uVar19 < sStack_1a0) * sStack_1a0 | ((short)uVar19 >= sStack_1a0) * uVar19;
  local_608._10_2_ =
       (ushort)((short)uVar20 < sStack_19e) * sStack_19e | ((short)uVar20 >= sStack_19e) * uVar20;
  local_608._12_2_ =
       (ushort)((short)uVar21 < sStack_19c) * sStack_19c | ((short)uVar21 >= sStack_19c) * uVar21;
  local_608._14_2_ =
       (ushort)((short)uVar22 < sStack_19a) * sStack_19a | ((short)uVar22 >= sStack_19a) * uVar22;
  auVar10._8_8_ = lStack_7a0;
  auVar10._0_8_ = local_7a8;
  auVar23 = paddsw(local_618,auVar10);
  local_5a0 = (__m128i *)&local_7a8;
  *local_6d0 = auVar23;
  auVar23 = paddsw(local_608,(undefined1  [16])*local_5a0);
  *local_598 = auVar23;
  *(undefined8 *)((long)local_8b0 + (long)(local_8b4 * 2) * -2) = local_8e8._8_8_;
  *(undefined8 *)((long)local_8b0 + (long)local_8b4 * -2) = local_8e8._0_8_;
  *local_8b0 = local_8f8._0_8_;
  *(undefined8 *)((long)local_8b0 + (long)local_8b4 * 2) = local_8f8._8_8_;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_4_sse2(uint16_t *s, int p,
                                      const uint8_t *_blimit,
                                      const uint8_t *_limit,
                                      const uint8_t *_thresh, int bd) {
  __m128i p1p0, q1q0;
  __m128i p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  __m128i p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  __m128i q0 = _mm_loadl_epi64((__m128i *)(s - 0 * p));
  __m128i q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));

  highbd_lpf_internal_4_sse2(&p1, &p0, &q0, &q1, &q1q0, &p1p0, _blimit, _limit,
                             _thresh, bd);

  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0, 8));
  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0);
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0, 8));
}